

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

void finish_pass(j_compress_ptr cinfo)

{
  jpeg_entropy_encoder *pjVar1;
  _func_void_j_compress_ptr **pp_Var2;
  int iVar3;
  jpeg_entropy_encoder *pjVar4;
  ulong uVar5;
  ulong uVar6;
  _func_void_j_compress_ptr_boolean *p_Var7;
  
  pjVar4 = cinfo->entropy;
  uVar5 = (ulong)((*(int *)&pjVar4[1].encode_mcu + (int)pjVar4[1].start_pass) - 1U & 0xffff0000);
  uVar6 = uVar5 + 0x8000;
  if ((long)pjVar4[1].start_pass <= (long)uVar5) {
    uVar6 = uVar5;
  }
  p_Var7 = (_func_void_j_compress_ptr_boolean *)(uVar6 << (*(byte *)&pjVar4[2].encode_mcu & 0x3f));
  pjVar4[1].start_pass = p_Var7;
  iVar3 = *(int *)((long)&pjVar4[2].encode_mcu + 4);
  if (((ulong)p_Var7 & 0xf8000000) == 0) {
    if (iVar3 == 0) {
      pjVar4[2].start_pass = pjVar4[2].start_pass + 1;
    }
    else if (-1 < iVar3) {
      p_Var7 = pjVar4[2].start_pass;
      while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
        emit_byte(0,cinfo);
        pjVar1 = pjVar4 + 2;
        pjVar1->start_pass = pjVar1->start_pass + -1;
        p_Var7 = pjVar1->start_pass;
      }
      emit_byte(*(int *)((long)&pjVar4[2].encode_mcu + 4),cinfo);
    }
    if (pjVar4[1].finish_pass != (_func_void_j_compress_ptr *)0x0) {
      p_Var7 = pjVar4[2].start_pass;
      while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
        emit_byte(0,cinfo);
        pjVar1 = pjVar4 + 2;
        pjVar1->start_pass = pjVar1->start_pass + -1;
        p_Var7 = pjVar1->start_pass;
      }
      do {
        emit_byte(0xff,cinfo);
        emit_byte(0,cinfo);
        pp_Var2 = &pjVar4[1].finish_pass;
        *pp_Var2 = *pp_Var2 + -1;
      } while (*pp_Var2 != (_func_void_j_compress_ptr *)0x0);
    }
  }
  else {
    if (-1 < iVar3) {
      p_Var7 = pjVar4[2].start_pass;
      while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
        emit_byte(0,cinfo);
        pjVar1 = pjVar4 + 2;
        pjVar1->start_pass = pjVar1->start_pass + -1;
        p_Var7 = pjVar1->start_pass;
      }
      emit_byte(*(int *)((long)&pjVar4[2].encode_mcu + 4) + 1,cinfo);
      if (*(int *)((long)&pjVar4[2].encode_mcu + 4) == 0xfe) {
        emit_byte(0,cinfo);
      }
    }
    pjVar4[2].start_pass =
         (_func_void_j_compress_ptr_boolean *)(pjVar4[1].finish_pass + (long)pjVar4[2].start_pass);
    pjVar4[1].finish_pass = (_func_void_j_compress_ptr *)0x0;
  }
  if (((ulong)pjVar4[1].start_pass & 0x7fff800) != 0) {
    p_Var7 = pjVar4[2].start_pass;
    while (p_Var7 != (_func_void_j_compress_ptr_boolean *)0x0) {
      emit_byte(0,cinfo);
      pjVar1 = pjVar4 + 2;
      pjVar1->start_pass = pjVar1->start_pass + -1;
      p_Var7 = pjVar1->start_pass;
    }
    emit_byte(*(uint *)&pjVar4[1].start_pass >> 0x13 & 0xff,cinfo);
    if ((~*(uint *)&pjVar4[1].start_pass & 0x7f80000) == 0) {
      emit_byte(0,cinfo);
    }
    if ((((ulong)pjVar4[1].start_pass & 0x7f800) != 0) &&
       (emit_byte((uint)pjVar4[1].start_pass >> 0xb & 0xff,cinfo),
       (~*(uint *)&pjVar4[1].start_pass & 0x7f800) == 0)) {
      emit_byte(0,cinfo);
      return;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass(j_compress_ptr cinfo)
{
  arith_entropy_ptr e = (arith_entropy_ptr)cinfo->entropy;
  JLONG temp;

  /* Section D.1.8: Termination of encoding */

  /* Find the e->c in the coding interval with the largest
   * number of trailing zero bits */
  if ((temp = (e->a - 1 + e->c) & 0xFFFF0000UL) < e->c)
    e->c = temp + 0x8000L;
  else
    e->c = temp;
  /* Send remaining bytes to output */
  e->c <<= e->ct;
  if (e->c & 0xF8000000UL) {
    /* One final overflow has to be handled */
    if (e->buffer >= 0) {
      if (e->zc)
        do emit_byte(0x00, cinfo);
        while (--e->zc);
      emit_byte(e->buffer + 1, cinfo);
      if (e->buffer + 1 == 0xFF)
        emit_byte(0x00, cinfo);
    }
    e->zc += e->sc;  /* carry-over converts stacked 0xFF bytes to 0x00 */
    e->sc = 0;
  } else {
    if (e->buffer == 0)
      ++e->zc;
    else if (e->buffer >= 0) {
      if (e->zc)
        do emit_byte(0x00, cinfo);
        while (--e->zc);
      emit_byte(e->buffer, cinfo);
    }
    if (e->sc) {
      if (e->zc)
        do emit_byte(0x00, cinfo);
        while (--e->zc);
      do {
        emit_byte(0xFF, cinfo);
        emit_byte(0x00, cinfo);
      } while (--e->sc);
    }
  }
  /* Output final bytes only if they are not 0x00 */
  if (e->c & 0x7FFF800L) {
    if (e->zc)  /* output final pending zero bytes */
      do emit_byte(0x00, cinfo);
      while (--e->zc);
    emit_byte((e->c >> 19) & 0xFF, cinfo);
    if (((e->c >> 19) & 0xFF) == 0xFF)
      emit_byte(0x00, cinfo);
    if (e->c & 0x7F800L) {
      emit_byte((e->c >> 11) & 0xFF, cinfo);
      if (((e->c >> 11) & 0xFF) == 0xFF)
        emit_byte(0x00, cinfo);
    }
  }
}